

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

void __thiscall
CVmObjFrameRef::load_image_data(CVmObjFrameRef *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  ushort uVar1;
  ushort uVar2;
  vm_frameref_ext *pvVar3;
  char *buf;
  int iVar4;
  vm_val_t *val;
  
  uVar1 = *(ushort *)ptr;
  uVar2 = *(ushort *)(ptr + 2);
  pvVar3 = alloc_ext(this,(uint)uVar1,(uint)uVar2);
  pvVar3->fp = (vm_val_t *)0x0;
  vmb_get_dh(ptr + 4,&pvVar3->entry);
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  vmb_get_dh(ptr + 9,&pvVar3->self);
  pvVar3->defobj = *(vm_obj_id_t *)(ptr + 0xe);
  pvVar3->targobj = *(vm_obj_id_t *)(ptr + 0x12);
  pvVar3->targprop = *(vm_prop_id_t *)(ptr + 0x16);
  vmb_get_dh(ptr + 0x18,&pvVar3->invokee);
  buf = ptr + 0x1d;
  val = pvVar3->vars;
  for (iVar4 = (uint)uVar2 + (uint)uVar1; 0 < iVar4; iVar4 = iVar4 + -1) {
    vmb_get_dh(buf,val);
    buf = buf + 5;
    val = val + 1;
  }
  return;
}

Assistant:

void CVmObjFrameRef::load_image_data(VMG_ vm_obj_id_t self,
                                     const char *ptr, size_t siz)
{
    /* read the number of variables */
    int nlocals = osrp2(ptr);
    int nparams = osrp2(ptr+2);
    ptr += 4;

    /* allocate the extension */
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* 
     *   Since stack frames are inherently transient, a saved frame ref
     *   object can't point back to a live stack frame, so on restore we have
     *   to assume that our stack frame is inactive.  
     */
    ext->fp = 0;

    /* load the entry pointer */
    vmb_get_dh(ptr, &ext->entry);
    ptr += VMB_DATAHOLDER;

    /* after other objects are loaded, resolve the entry pointer */
    G_obj_table->request_post_load_init(self);

    /* load the method context variables */
    vmb_get_dh(ptr, &ext->self);
    ptr += VMB_DATAHOLDER;

    ext->defobj = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    ext->targobj = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    ext->targprop = vmb_get_propid(ptr);
    ptr += VMB_PROP_ID;

    vmb_get_dh(ptr, &ext->invokee);
    ptr += VMB_DATAHOLDER;

    /* read the variable snapshot values */
    int i;
    vm_val_t *v;
    for (i = nlocals + nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        vmb_get_dh(ptr, v);
        ptr += VMB_DATAHOLDER;
    }
}